

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O3

void __thiscall JPG::discreteCosineTransform(JPG *this)

{
  MCU *pMVar1;
  Block *padVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Block **ppadVar7;
  uint uVar8;
  double *pdVar9;
  long lVar10;
  uint componentID;
  uint ID;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  uVar8 = this->mcuHeight;
  if (uVar8 != 0) {
    uVar4 = this->mcuWidth;
    uVar11 = 0;
    do {
      uVar13 = 0;
      if (uVar4 != 0) {
        uVar8 = 0;
        do {
          pMVar1 = this->data;
          ID = 1;
          do {
            uVar5 = getVerticalSamplingFrequency(this,ID);
            if (uVar5 != 0) {
              uVar13 = 0;
              do {
                uVar5 = getHorizontalSamplingFrequency(this,ID);
                if (uVar5 != 0) {
                  uVar14 = 0;
                  do {
                    ppadVar7 = MCU::operator[](pMVar1 + (uVar4 * uVar11 + uVar8),ID);
                    padVar2 = *ppadVar7;
                    uVar5 = getHorizontalSamplingFrequency(this,ID);
                    uVar6 = uVar5 * uVar13 + uVar14;
                    pdVar9 = padVar2[uVar6];
                    lVar10 = 0;
                    do {
                      lVar12 = 0;
                      do {
                        dVar3 = (pdVar9 + lVar12)[1];
                        pdVar9[lVar12] = pdVar9[lVar12] + -128.0;
                        (pdVar9 + lVar12)[1] = dVar3 + -128.0;
                        lVar12 = lVar12 + 2;
                      } while (lVar12 != 8);
                      lVar10 = lVar10 + 1;
                      pdVar9 = pdVar9 + 8;
                    } while (lVar10 != 8);
                    DCT(padVar2 + uVar6);
                    uVar14 = uVar14 + 1;
                    uVar5 = getHorizontalSamplingFrequency(this,ID);
                  } while (uVar14 < uVar5);
                }
                uVar13 = uVar13 + 1;
                uVar5 = getVerticalSamplingFrequency(this,ID);
              } while (uVar13 < uVar5);
            }
            ID = ID + 1;
          } while (ID != 4);
          uVar8 = uVar8 + 1;
          uVar4 = this->mcuWidth;
        } while (uVar8 < uVar4);
        uVar8 = this->mcuHeight;
        uVar13 = uVar4;
      }
      uVar4 = uVar13;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar8);
  }
  return;
}

Assistant:

void JPG::discreteCosineTransform() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        //在进行DCT变化之前把0~255变化到-128~127
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                currentBlock[y * 8 + x] = currentBlock[y * 8 + x] - 128.0;
                            }
                        }
                        DCT(currentBlock); 
                    }
                }             
            }
        }
    }  
}